

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccesscachebackend.cpp
# Opt level: O3

bool __thiscall QNetworkAccessCacheBackend::sendCacheContents(QNetworkAccessCacheBackend *this)

{
  bool bVar1;
  Operation OVar2;
  QAbstractNetworkCache *pQVar3;
  long lVar4;
  QIODevice *pQVar5;
  long in_FS_OFFSET;
  QByteArrayView QVar6;
  QLatin1String QVar7;
  QLatin1String QVar8;
  QHttpHeaders headers;
  AttributesMap attributes;
  QNetworkCacheMetaData item;
  QUrl local_78;
  QNetworkCacheMetaData local_70;
  QHash<QNetworkRequest::Attribute,_QVariant> local_68;
  QNetworkCacheMetaData local_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = false;
  QNetworkAccessBackend::setCachingEnabled((QNetworkAccessBackend *)this,false);
  pQVar3 = QNetworkAccessBackend::networkCache((QNetworkAccessBackend *)this);
  if (pQVar3 != (QAbstractNetworkCache *)0x0) {
    local_60.d.d.ptr = (QSharedDataPointer<QNetworkCacheMetaDataPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QNetworkAccessBackend::url((QNetworkAccessBackend *)local_58.data);
    (**(code **)(*(long *)pQVar3 + 0x60))(&local_60,pQVar3,&local_58);
    QUrl::~QUrl((QUrl *)&local_58.shared);
    bVar1 = QNetworkCacheMetaData::isValid(&local_60);
    if (bVar1) {
      local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      QNetworkCacheMetaData::attributes(&local_60);
      local_70.d.d.ptr =
           (QSharedDataPointer<QNetworkCacheMetaDataPrivate>)
           ((ulong)local_70.d.d.ptr & 0xffffffff00000000);
      QHash<QNetworkRequest::Attribute,_QVariant>::value
                ((QVariant *)&local_58,&local_68,(Attribute *)&local_70);
      bVar1 = false;
      QNetworkAccessBackend::setAttribute
                ((QNetworkAccessBackend *)this,HttpStatusCodeAttribute,(QVariant *)&local_58);
      QVariant::~QVariant((QVariant *)&local_58);
      local_70.d.d.ptr._0_4_ = 1;
      QHash<QNetworkRequest::Attribute,_QVariant>::value
                ((QVariant *)&local_58,&local_68,(Attribute *)&local_70);
      QNetworkAccessBackend::setAttribute
                ((QNetworkAccessBackend *)this,HttpReasonPhraseAttribute,(QVariant *)&local_58);
      QVariant::~QVariant((QVariant *)&local_58);
      local_70.d.d.ptr = (QSharedDataPointer<QNetworkCacheMetaDataPrivate>)&DAT_aaaaaaaaaaaaaaaa;
      QNetworkCacheMetaData::headers(&local_70);
      QVar6 = QHttpHeaders::value((QHttpHeaders *)&local_70,CacheControl,(QByteArrayView)ZEXT816(0))
      ;
      QVar7.m_data = "must-revalidate";
      QVar7.m_size = 0xf;
      lVar4 = QtPrivate::findString((QLatin1String)QVar6,0,QVar7,CaseInsensitive);
      if (lVar4 == -1) {
        bVar1 = false;
        QVar8.m_data = "no-cache";
        QVar8.m_size = 8;
        lVar4 = QtPrivate::findString((QLatin1String)QVar6,0,QVar8,CaseInsensitive);
        if (lVar4 == -1) {
          QNetworkAccessBackend::setHeaders((QNetworkAccessBackend *)this,(QHttpHeaders *)&local_70)
          ;
          local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
          puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
          local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
          local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_78.d._0_4_ = 2;
          QHash<QNetworkRequest::Attribute,_QVariant>::value
                    ((QVariant *)&local_58,&local_68,(Attribute *)&local_78);
          if ((undefined1 *)0x3 < puStack_40) {
            QNetworkAccessBackend::setAttribute
                      ((QNetworkAccessBackend *)this,RedirectionTargetAttribute,
                       (QVariant *)&local_58);
            QVariant::toUrl();
            QNetworkAccessBackend::redirectionRequested((QNetworkAccessBackend *)this,&local_78);
            QUrl::~QUrl(&local_78);
          }
          QNetworkAccessBackend::metaDataChanged((QNetworkAccessBackend *)this);
          OVar2 = QNetworkAccessBackend::operation((QNetworkAccessBackend *)this);
          bVar1 = true;
          if (OVar2 == GetOperation) {
            QNetworkAccessBackend::url((QNetworkAccessBackend *)&local_78);
            pQVar5 = (QIODevice *)(**(code **)(*(long *)pQVar3 + 0x70))(pQVar3,&local_78);
            this->device = pQVar5;
            QUrl::~QUrl(&local_78);
            if ((QObject *)this->device == (QObject *)0x0) {
              bVar1 = false;
            }
            else {
              QObject::setParent((QObject *)this->device);
              QNetworkAccessBackend::readyRead((QNetworkAccessBackend *)this);
            }
          }
          QVariant::~QVariant((QVariant *)&local_58);
        }
      }
      QHttpHeaders::~QHttpHeaders((QHttpHeaders *)&local_70);
      QHash<QNetworkRequest::Attribute,_QVariant>::~QHash(&local_68);
    }
    else {
      bVar1 = false;
    }
    QNetworkCacheMetaData::~QNetworkCacheMetaData(&local_60);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QNetworkAccessCacheBackend::sendCacheContents()
{
    setCachingEnabled(false);
    QAbstractNetworkCache *nc = networkCache();
    if (!nc)
        return false;

    QNetworkCacheMetaData item = nc->metaData(url());
    if (!item.isValid())
        return false;

    QNetworkCacheMetaData::AttributesMap attributes = item.attributes();
    setAttribute(QNetworkRequest::HttpStatusCodeAttribute,
                 attributes.value(QNetworkRequest::HttpStatusCodeAttribute));
    setAttribute(QNetworkRequest::HttpReasonPhraseAttribute,
                 attributes.value(QNetworkRequest::HttpReasonPhraseAttribute));

    // set the headers
    auto headers = item.headers();
    const auto cacheControlValue = QLatin1StringView(
            headers.value(QHttpHeaders::WellKnownHeader::CacheControl));
    // RFC 9111 Section 5.2 Cache Control
    if (cacheControlValue.contains("must-revalidate"_L1, Qt::CaseInsensitive)
        || cacheControlValue.contains("no-cache"_L1, Qt::CaseInsensitive)) {
        return false;
    }
    setHeaders(std::move(headers));

    // handle a possible redirect
    QVariant redirectionTarget = attributes.value(QNetworkRequest::RedirectionTargetAttribute);
    if (redirectionTarget.isValid()) {
        setAttribute(QNetworkRequest::RedirectionTargetAttribute, redirectionTarget);
        redirectionRequested(redirectionTarget.toUrl());
    }

    // signal we're open
    metaDataChanged();

    if (operation() == QNetworkAccessManager::GetOperation) {
        device = nc->data(url());
        if (!device)
            return false;
        device->setParent(this);
        readyRead();
    }

#if defined(QNETWORKACCESSCACHEBACKEND_DEBUG)
    qDebug() << "Successfully sent cache:" << url();
#endif
    return true;
}